

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O0

VarType * __thiscall
deqp::RandomUniformBlockCase::generateType
          (VarType *__return_storage_ptr__,RandomUniformBlockCase *this,Random *rnd,int typeDepth,
          bool arrayOk)

{
  pointer *__return_storage_ptr___00;
  bool bVar1;
  uint uVar2;
  DataType dataType;
  char *pcVar3;
  StructType *pSVar4;
  reference type_00;
  iterator first;
  iterator last;
  int ndx_00;
  VarType *pVVar5;
  float fVar6;
  bool local_239;
  deUint32 local_1f4;
  deUint32 flags_1;
  value_type local_1d8;
  DataType type;
  value_type local_1d0 [22];
  undefined1 local_178 [8];
  vector<glu::DataType,_std::allocator<glu::DataType>_> typeCandidates;
  VarType elementType;
  int arrayLength;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  uint local_100;
  int local_fc;
  deUint32 flags;
  int ndx_1;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  StructType *local_90;
  StructType *structType;
  int local_70;
  int ndx;
  int local_5c;
  undefined1 local_58 [4];
  int numMembers;
  vector<deqp::ub::VarType,_std::allocator<deqp::ub::VarType>_> memberTypes;
  bool unusedOk;
  float unusedFragWeight;
  float unusedVtxWeight;
  float arrayWeight;
  float structWeight;
  bool arrayOk_local;
  int typeDepth_local;
  Random *rnd_local;
  RandomUniformBlockCase *this_local;
  
  if ((typeDepth < this->m_maxStructDepth) &&
     (pVVar5 = __return_storage_ptr__, fVar6 = de::Random::getFloat(rnd), fVar6 < 0.1)) {
    memberTypes.super__Vector_base<deqp::ub::VarType,_std::allocator<deqp::ub::VarType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = (byte)(this->m_features >> 10) & 1;
    std::vector<deqp::ub::VarType,_std::allocator<deqp::ub::VarType>_>::vector
              ((vector<deqp::ub::VarType,_std::allocator<deqp::ub::VarType>_> *)local_58);
    local_5c = de::Random::getInt(rnd,1,this->m_maxStructMembers);
    for (local_70 = 0; ndx_00 = (int)pVVar5, local_70 < local_5c; local_70 = local_70 + 1) {
      pVVar5 = (VarType *)&DAT_00000001;
      generateType((VarType *)&structType,this,rnd,typeDepth + 1,true);
      std::vector<deqp::ub::VarType,_std::allocator<deqp::ub::VarType>_>::push_back
                ((vector<deqp::ub::VarType,_std::allocator<deqp::ub::VarType>_> *)local_58,
                 (value_type *)&structType);
      ub::VarType::~VarType((VarType *)&structType);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"s",&local_d1);
    genName_abi_cxx11_((string *)&flags,(deqp *)0x41,'Z',(char)this->m_structNdx,ndx_00);
    std::operator+(&local_b0,&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pSVar4 = ub::ShaderInterface::allocStruct(&(this->super_UniformBlockCase).m_interface,pcVar3);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&flags);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    this->m_structNdx = this->m_structNdx + 1;
    local_90 = pSVar4;
    for (local_fc = 0; local_fc < local_5c; local_fc = local_fc + 1) {
      local_100 = 0;
      bVar1 = false;
      if ((memberTypes.super__Vector_base<deqp::ub::VarType,_std::allocator<deqp::ub::VarType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        fVar6 = de::Random::getFloat(rnd);
        bVar1 = fVar6 < 0.15;
      }
      uVar2 = 0;
      if (bVar1) {
        uVar2 = 0x400;
      }
      local_100 = uVar2 | local_100;
      local_239 = false;
      if ((memberTypes.super__Vector_base<deqp::ub::VarType,_std::allocator<deqp::ub::VarType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        fVar6 = de::Random::getFloat(rnd);
        local_239 = fVar6 < 0.15;
      }
      pSVar4 = local_90;
      local_100 = local_100 | (uint)local_239 << 0xb;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arrayLength,"m",(allocator<char> *)((long)&elementType.m_data + 0xf));
      std::operator+(&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &arrayLength,(char)local_fc + 'A');
      pcVar3 = (char *)std::__cxx11::string::c_str();
      type_00 = std::vector<deqp::ub::VarType,_std::allocator<deqp::ub::VarType>_>::operator[]
                          ((vector<deqp::ub::VarType,_std::allocator<deqp::ub::VarType>_> *)local_58
                           ,(long)local_fc);
      ub::StructType::addMember(pSVar4,pcVar3,type_00,local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&arrayLength);
      std::allocator<char>::~allocator((allocator<char> *)((long)&elementType.m_data + 0xf));
    }
    ub::VarType::VarType(__return_storage_ptr__,local_90);
    std::vector<deqp::ub::VarType,_std::allocator<deqp::ub::VarType>_>::~vector
              ((vector<deqp::ub::VarType,_std::allocator<deqp::ub::VarType>_> *)local_58);
    return __return_storage_ptr__;
  }
  if (((0 < this->m_maxArrayLength) && (arrayOk)) &&
     (fVar6 = de::Random::getFloat(rnd), fVar6 < 0.1)) {
    elementType.m_data.array.size = de::Random::getInt(rnd,1,this->m_maxArrayLength);
    __return_storage_ptr___00 =
         &typeCandidates.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    generateType((VarType *)__return_storage_ptr___00,this,rnd,typeDepth,false);
    ub::VarType::VarType
              (__return_storage_ptr__,(VarType *)__return_storage_ptr___00,
               elementType.m_data.array.size);
    ub::VarType::~VarType
              ((VarType *)
               &typeCandidates.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    return __return_storage_ptr__;
  }
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::vector
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178);
  local_1d0[0x15] = 1;
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 0x15);
  local_1d0[0x14] = 0x1b;
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 0x14);
  local_1d0[0x13] = 0x1f;
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 0x13);
  local_1d0[0x12] = 0x23;
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 0x12);
  if ((this->m_features & 1) != 0) {
    local_1d0[0x11] = 2;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 0x11);
    local_1d0[0x10] = 3;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 0x10);
    local_1d0[0xf] = 4;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 0xf);
    local_1d0[0xe] = 0x1c;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 0xe);
    local_1d0[0xd] = 0x1d;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 0xd);
    local_1d0[0xc] = 0x1e;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 0xc);
    local_1d0[0xb] = 0x20;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 0xb);
    local_1d0[10] = 0x21;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 10);
    local_1d0[9] = 0x22;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 9);
    local_1d0[8] = 0x24;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 8);
    local_1d0[7] = 0x25;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 7);
    local_1d0[6] = 0x26;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 6);
  }
  if ((this->m_features & 2) != 0) {
    local_1d0[5] = 5;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 5);
    local_1d0[4] = 6;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 4);
    local_1d0[3] = 8;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 3);
    local_1d0[2] = 9;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 2);
    local_1d0[1] = 10;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0 + 1);
    local_1d0[0] = TYPE_FLOAT_MAT4X2;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,local_1d0);
    type = TYPE_FLOAT_MAT4X3;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,&type);
    local_1d8 = TYPE_FLOAT_MAT4;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178,&local_1d8);
  }
  first = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::begin
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178);
  last = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::end
                   ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178);
  dataType = de::Random::
             choose<glu::DataType,__gnu_cxx::__normal_iterator<glu::DataType*,std::vector<glu::DataType,std::allocator<glu::DataType>>>>
                       (rnd,(__normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
                             )first._M_current,
                        (__normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
                         )last._M_current);
  local_1f4 = 0;
  bVar1 = glu::isDataTypeBoolOrBVec(dataType);
  if (!bVar1) {
    local_1f4 = de::Random::choose<unsigned_int,unsigned_int_const*>
                          (rnd,generateType::precisionCandidates,(uint *)&DAT_02b35a38);
  }
  ub::VarType::VarType(__return_storage_ptr__,dataType,local_1f4);
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::~vector
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_178);
  return __return_storage_ptr__;
}

Assistant:

VarType RandomUniformBlockCase::generateType(de::Random& rnd, int typeDepth, bool arrayOk)
{
	const float structWeight = 0.1f;
	const float arrayWeight  = 0.1f;

	if (typeDepth < m_maxStructDepth && rnd.getFloat() < structWeight)
	{
		const float		unusedVtxWeight  = 0.15f;
		const float		unusedFragWeight = 0.15f;
		bool			unusedOk		 = (m_features & FEATURE_UNUSED_MEMBERS) != 0;
		vector<VarType> memberTypes;
		int				numMembers = rnd.getInt(1, m_maxStructMembers);

		// Generate members first so nested struct declarations are in correct order.
		for (int ndx = 0; ndx < numMembers; ndx++)
			memberTypes.push_back(generateType(rnd, typeDepth + 1, true));

		StructType& structType = m_interface.allocStruct((string("s") + genName('A', 'Z', m_structNdx)).c_str());
		m_structNdx += 1;

		DE_ASSERT(numMembers <= 'Z' - 'A');
		for (int ndx = 0; ndx < numMembers; ndx++)
		{
			deUint32 flags = 0;

			flags |= (unusedOk && rnd.getFloat() < unusedVtxWeight) ? UNUSED_VERTEX : 0;
			flags |= (unusedOk && rnd.getFloat() < unusedFragWeight) ? UNUSED_FRAGMENT : 0;

			structType.addMember((string("m") + (char)('A' + ndx)).c_str(), memberTypes[ndx], flags);
		}

		return VarType(&structType);
	}
	else if (m_maxArrayLength > 0 && arrayOk && rnd.getFloat() < arrayWeight)
	{
		int		arrayLength = rnd.getInt(1, m_maxArrayLength);
		VarType elementType = generateType(rnd, typeDepth, false /* nested arrays are not allowed */);
		return VarType(elementType, arrayLength);
	}
	else
	{
		vector<glu::DataType> typeCandidates;

		typeCandidates.push_back(glu::TYPE_FLOAT);
		typeCandidates.push_back(glu::TYPE_INT);
		typeCandidates.push_back(glu::TYPE_UINT);
		typeCandidates.push_back(glu::TYPE_BOOL);

		if (m_features & FEATURE_VECTORS)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC2);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC3);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC4);
			typeCandidates.push_back(glu::TYPE_INT_VEC2);
			typeCandidates.push_back(glu::TYPE_INT_VEC3);
			typeCandidates.push_back(glu::TYPE_INT_VEC4);
			typeCandidates.push_back(glu::TYPE_UINT_VEC2);
			typeCandidates.push_back(glu::TYPE_UINT_VEC3);
			typeCandidates.push_back(glu::TYPE_UINT_VEC4);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC2);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC3);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC4);
		}

		if (m_features & FEATURE_MATRICES)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X4);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4);
		}

		glu::DataType type  = rnd.choose<glu::DataType>(typeCandidates.begin(), typeCandidates.end());
		deUint32	  flags = 0;

		if (!glu::isDataTypeBoolOrBVec(type))
		{
			// Precision.
			static const deUint32 precisionCandidates[] = { PRECISION_LOW, PRECISION_MEDIUM, PRECISION_HIGH };
			flags |= rnd.choose<deUint32>(&precisionCandidates[0],
										  &precisionCandidates[DE_LENGTH_OF_ARRAY(precisionCandidates)]);
		}

		return VarType(type, flags);
	}
}